

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O1

void duckdb::PrimitiveColumnWriter::WriteLevels
               (WriteStream *temp_writer,unsafe_vector<uint16_t> *levels,idx_t max_value,
               idx_t offset,idx_t count,optional_idx null_count)

{
  Allocator *pAVar1;
  idx_t iVar2;
  unsigned_long val;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  idx_t i;
  MemoryStream intermediate_stream;
  uint local_894;
  WriteStream *local_890;
  optional_idx local_888;
  MemoryStream local_880 [48];
  RleBpEncoder local_850;
  
  if ((count != 0) &&
     ((levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (max_value == 0) {
      local_850.bit_width = 0;
    }
    else {
      bVar5 = 0;
      do {
        bVar5 = bVar5 + 1;
      } while (max_value >> (bVar5 & 0x3f) != 0);
      local_850.bit_width = (uint32_t)bVar5;
    }
    local_850.byte_width = local_850.bit_width + 7 >> 3;
    local_890 = temp_writer;
    local_888.index = null_count.index;
    memset(local_850.bp_block,0,0x800);
    pAVar1 = (Allocator *)duckdb::Allocator::DefaultAllocator();
    duckdb::MemoryStream::MemoryStream(local_880,pAVar1,0x200);
    local_850.rle_count = 0;
    local_850.bp_block_count = 0;
    if ((local_888.index == 0xffffffffffffffff) ||
       (iVar2 = optional_idx::GetIndex(&local_888), iVar2 != 0)) {
      if (offset < count + offset) {
        do {
          local_894 = (uint)(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[offset];
          RleBpEncoder::WriteValue(&local_850,(WriteStream *)local_880,&local_894);
          offset = offset + 1;
          count = count - 1;
        } while (count != 0);
      }
    }
    else {
      RleBpEncoder::WriteMany
                (&local_850,(WriteStream *)local_880,
                 (uint)*(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,count);
    }
    RleBpEncoder::WriteRun(&local_850,(WriteStream *)local_880);
    val = duckdb::MemoryStream::GetPosition();
    local_894 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
    (*(code *)**(undefined8 **)local_890)(local_890,&local_894,4);
    uVar3 = duckdb::MemoryStream::GetData();
    uVar4 = duckdb::MemoryStream::GetPosition();
    (*(code *)**(undefined8 **)local_890)(local_890,uVar3,uVar4);
    duckdb::MemoryStream::~MemoryStream(local_880);
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::WriteLevels(WriteStream &temp_writer, const unsafe_vector<uint16_t> &levels,
                                        idx_t max_value, idx_t offset, idx_t count, optional_idx null_count) {
	if (levels.empty() || count == 0) {
		return;
	}

	// write the levels using the RLE-BP encoding
	const auto bit_width = RleBpDecoder::ComputeBitWidth((max_value));
	RleBpEncoder rle_encoder(bit_width);

	// have to write to an intermediate stream first because we need to know the size
	MemoryStream intermediate_stream(Allocator::DefaultAllocator());

	rle_encoder.BeginWrite();
	if (null_count.IsValid() && null_count.GetIndex() == 0) {
		// Fast path: no nulls
		rle_encoder.WriteMany(intermediate_stream, levels[0], count);
	} else {
		for (idx_t i = offset; i < offset + count; i++) {
			rle_encoder.WriteValue(intermediate_stream, levels[i]);
		}
	}
	rle_encoder.FinishWrite(intermediate_stream);

	// start off by writing the byte count as a uint32_t
	temp_writer.Write(NumericCast<uint32_t>(intermediate_stream.GetPosition()));
	// copy over the written data
	temp_writer.WriteData(intermediate_stream.GetData(), intermediate_stream.GetPosition());
}